

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O1

bool __thiscall ON_CompressedBuffer::WriteChar(ON_CompressedBuffer *this,size_t count,void *buffer)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (buffer == (void *)0x0 || count == 0) {
    bVar5 = count == 0;
  }
  else {
    uVar3 = this->m_sizeof_compressed + count;
    uVar1 = this->m_buffer_compressed_capacity;
    uVar4 = uVar3 - uVar1;
    if (uVar1 <= uVar3 && uVar4 != 0) {
      uVar3 = uVar1 >> 2;
      if (uVar1 >> 2 < uVar4) {
        uVar3 = uVar4;
      }
      uVar4 = 0x800;
      if (0x800 < uVar3) {
        uVar4 = uVar3;
      }
      this->m_buffer_compressed_capacity = uVar4 + uVar1;
      pvVar2 = onrealloc(this->m_buffer_compressed,uVar4 + uVar1);
      this->m_buffer_compressed = pvVar2;
      if (pvVar2 == (void *)0x0) {
        this->m_buffer_compressed_capacity = 0;
        this->m_sizeof_compressed = 0;
        return false;
      }
    }
    memcpy((void *)((long)this->m_buffer_compressed + this->m_sizeof_compressed),buffer,count);
    this->m_sizeof_compressed = this->m_sizeof_compressed + count;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool ON_CompressedBuffer::WriteChar( 
        size_t count, const void* buffer         
        )
{
  bool rc = true;
  if ( count > 0 && buffer )
  {
    if ( count + m_sizeof_compressed > m_buffer_compressed_capacity )
    {
      size_t delta = count + m_sizeof_compressed - m_buffer_compressed_capacity;
      if ( delta < 2048 )
        delta = 2048;
      if ( delta < m_buffer_compressed_capacity/4 )
        delta = m_buffer_compressed_capacity/4;
      m_buffer_compressed_capacity += delta;
      m_buffer_compressed = onrealloc(m_buffer_compressed,m_buffer_compressed_capacity);
      if ( !m_buffer_compressed )
      {
        m_buffer_compressed_capacity = 0;
        m_sizeof_compressed = 0;
        return false;
      }
    }
    memcpy(((char*)m_buffer_compressed)+m_sizeof_compressed,buffer,count);
    m_sizeof_compressed += count;
  }
  else
  {
    rc = (0 == count);
  }
  return rc;
}